

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O2

RealType __thiscall
OpenMD::EAM::Zhou2001Functional
          (EAM *this,RealType rho,RealType rhoe,vector<double,_std::allocator<double>_> *Fn,
          vector<double,_std::allocator<double>_> *F,RealType Fe,RealType eta)

{
  reference pvVar1;
  double dVar2;
  double dVar3;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_20 = rhoe * 0.85;
  if (local_20 <= rho) {
    if ((rho < local_20) || (rhoe * 1.15 <= rho)) {
      if (rho < rhoe * 1.15) {
        return 0.0;
      }
      dVar2 = pow(rho / rhoe,eta);
      dVar2 = log(dVar2);
      dVar3 = pow(rho / rhoe,eta);
      return dVar3 * (1.0 - dVar2) * Fe;
    }
    local_20 = rho / rhoe;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,0);
    local_28 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,1);
    local_30 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(F,2);
    local_18 = *pvVar1;
    Fn = F;
  }
  else {
    local_20 = rho / local_20;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,0);
    local_28 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,1);
    local_30 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,2);
    local_18 = *pvVar1;
  }
  local_20 = local_20 + -1.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::at(Fn,3);
  return ((*pvVar1 * local_20 + local_18) * local_20 + local_30) * local_20 + local_28;
}

Assistant:

RealType EAM::Zhou2001Functional(RealType rho, RealType rhoe,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType Fe,
                                   RealType eta) {
    RealType rhon = 0.85 * rhoe;
    RealType rho0 = 1.15 * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rho >= rhon && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F.at(3)));
    } else if (rho >= rho0) {
      t          = rho / rhoe;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }